

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_constants_world(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"max-depth");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x5c) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"day-length");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x5e) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"dungeon-hgt");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x60) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"dungeon-wid");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x62) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"town-hgt");
            if (iVar2 == 0) {
              *(undefined2 *)((long)pvVar4 + 100) = uVar5;
            }
            else {
              iVar2 = strcmp(__s1,"town-wid");
              if (iVar2 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x66) = uVar5;
              }
              else {
                iVar2 = strcmp(__s1,"feeling-total");
                if (iVar2 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x68) = uVar5;
                }
                else {
                  iVar2 = strcmp(__s1,"feeling-need");
                  if (iVar2 == 0) {
                    *(undefined2 *)((long)pvVar4 + 0x6a) = uVar5;
                  }
                  else {
                    iVar2 = strcmp(__s1,"stair-skip");
                    if (iVar2 == 0) {
                      *(undefined2 *)((long)pvVar4 + 0x6c) = uVar5;
                    }
                    else {
                      iVar2 = strcmp(__s1,"move-energy");
                      if (iVar2 != 0) {
                        return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                      }
                      *(undefined2 *)((long)pvVar4 + 0x6e) = uVar5;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_world(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "max-depth"))
		z->max_depth = value;
	else if (streq(label, "day-length"))
		z->day_length = value;
	else if (streq(label, "dungeon-hgt"))
		z->dungeon_hgt = value;
	else if (streq(label, "dungeon-wid"))
		z->dungeon_wid = value;
	else if (streq(label, "town-hgt"))
		z->town_hgt = value;
	else if (streq(label, "town-wid"))
		z->town_wid = value;
	else if (streq(label, "feeling-total"))
		z->feeling_total = value;
	else if (streq(label, "feeling-need"))
		z->feeling_need = value;
	else if (streq(label, "stair-skip"))
		z->stair_skip = value;
	else if (streq(label, "move-energy"))
		z->move_energy = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}